

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

string * __thiscall
despot::BaseTag::RandomMap_abi_cxx11_
          (string *__return_storage_ptr__,BaseTag *this,int height,int width,int obstacles)

{
  size_type *psVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  long lVar6;
  long *plVar7;
  ulong *puVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  ulong uVar10;
  undefined8 uVar11;
  int iVar12;
  string map;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  long *local_130;
  long local_128;
  long local_120 [2];
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  string local_d0;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,(char)(width + 1) * (char)height + -1);
  if (1 < height) {
    lVar9 = (long)width;
    lVar6 = (ulong)(uint)height - 1;
    do {
      *(undefined1 *)((long)local_130 + lVar9) = 10;
      lVar9 = lVar9 + (width + 1);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  if (0 < obstacles) {
    iVar12 = 0;
    do {
      iVar3 = despot::Random::NextInt(0x121170);
      cVar2 = *(char *)((long)local_130 + (long)iVar3);
      if ((cVar2 != '\n') && (cVar2 != '#')) {
        *(undefined1 *)((long)local_130 + (long)iVar3) = 0x23;
        iVar12 = iVar12 + 1;
      }
    } while (iVar12 < obstacles);
  }
  to_string<int>(&local_50,height);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1190b7);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_100 = *puVar8;
    lStack_f8 = plVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar8;
    local_110 = (ulong *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  to_string<int>(&local_b0,width);
  uVar10 = 0xf;
  if (local_110 != &local_100) {
    uVar10 = local_100;
  }
  if (uVar10 < local_b0._M_string_length + local_108) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar11 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_b0._M_string_length + local_108) goto LAB_0010e0ae;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0010e0ae:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_b0._M_dataplus._M_p);
  }
  local_150 = &local_140;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_140 = *plVar4;
    uStack_138 = puVar5[3];
  }
  else {
    local_140 = *plVar4;
    local_150 = (long *)*puVar5;
  }
  local_148 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_e0 = *puVar8;
    uStack_d8 = (undefined4)plVar4[3];
    uStack_d4 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar8;
    local_f0 = (ulong *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_130,local_128 + (long)local_130);
  to_string<std::__cxx11::string>(&local_d0,(despot *)local_70,t);
  uVar10 = 0xf;
  if (local_f0 != &local_e0) {
    uVar10 = local_e0;
  }
  if (uVar10 < local_d0._M_string_length + local_e8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar11 = local_d0.field_2._M_allocated_capacity;
    }
    if (local_d0._M_string_length + local_e8 <= (ulong)uVar11) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0010e212;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0._M_dataplus._M_p);
LAB_0010e212:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar11 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar11;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string BaseTag::RandomMap(int height, int width, int obstacles) {
	string map(height * (width + 1) - 1, '.');
	for (int h = 1; h < height; h++)
		map[h * (width + 1) - 1] = '\n';

	for (int i = 0; i < obstacles;) {
		int p = Random::RANDOM.NextInt(map.length());
		if (map[p] != '\n' && map[p] != '#') {
			map[p] = '#';
			i++;
		}
	}

	return "mapSize = " + to_string(height) + " " + to_string(width) + "\n" + to_string(map);
}